

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerStep * sqlite3TriggerSelectStep(sqlite3 *db,Select *pSelect)

{
  TriggerStep *pTVar1;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocRaw(db,0x50);
  if (pTVar1 == (TriggerStep *)0x0) {
    sqlite3SelectDelete(db,pSelect);
  }
  else {
    *(undefined8 *)((long)&pTVar1->pSelect + 2) = 0;
    *(undefined8 *)((long)&(pTVar1->target).z + 2) = 0;
    *(undefined8 *)&pTVar1->field_0x2 = 0;
    *(undefined8 *)((long)&pTVar1->pTrig + 2) = 0;
    pTVar1->pNext = (TriggerStep *)0x0;
    pTVar1->pLast = (TriggerStep *)0x0;
    *(undefined8 *)((long)&pTVar1->pExprList + 2) = 0;
    *(undefined8 *)((long)&pTVar1->pIdList + 2) = 0;
    *(undefined8 *)((long)&(pTVar1->target).n + 2) = 0;
    *(undefined8 *)((long)&pTVar1->pWhere + 2) = 0;
    pTVar1->op = 't';
    pTVar1->orconf = 'c';
    pTVar1->pSelect = pSelect;
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerSelectStep(sqlite3 *db, Select *pSelect){
  TriggerStep *pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep));
  if( pTriggerStep==0 ) {
    sqlite3SelectDelete(db, pSelect);
    return 0;
  }
  pTriggerStep->op = TK_SELECT;
  pTriggerStep->pSelect = pSelect;
  pTriggerStep->orconf = OE_Default;
  return pTriggerStep;
}